

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblkof.c
# Opt level: O2

void tommy_arrayblkof_done(tommy_arrayblkof *array)

{
  long lVar1;
  void *__ptr;
  uint pos;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (pos = 0; pos < (array->block).count; pos = pos + 1) {
    __ptr = tommy_array_get(&array->block,pos);
    free(__ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    tommy_array_done(&array->block);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayblkof_done(tommy_arrayblkof* array)
{
	tommy_count_t i;

	for (i = 0; i < tommy_array_size(&array->block); ++i)
		tommy_free(tommy_array_get(&array->block, i));

	tommy_array_done(&array->block);
}